

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_5U,_buffer_layout_dfs>::operator()
          (fill<64U,_5U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  unsigned_long *puVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  int iVar4;
  ostream *poVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  uchar **ppuVar8;
  long lVar9;
  size_t sVar10;
  size_t n0;
  unsigned_long *puVar11;
  unsigned_long uVar12;
  fill<64U,_10U,_buffer_layout_dfs> local_5c;
  fill<64U,_11U,_buffer_layout_dfs> local_5b;
  fill<64U,_11U,_buffer_layout_dfs> local_5a;
  fill<64U,_10U,_buffer_layout_dfs> local_59;
  uchar **local_58;
  array<Stream,_64UL> *local_50;
  uchar **local_48;
  DI __d;
  
  local_50 = streams;
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"fill_inner");
  poVar5 = std::operator<<(poVar5,", inner, I=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 10;
  puVar11 = buffer_count->_M_elems + 0xb;
  local_48 = buffer + 0x50e;
  local_58 = buffer + 0x4f7;
  n0 = 0;
  lVar9 = 0;
  do {
    uVar7 = *puVar1;
    if (uVar7 == 0) {
      fill<64U,_10U,_buffer_layout_dfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"left stream drained\n");
        sVar10 = -lVar9;
        lVar9 = -n0;
        uVar7 = *puVar11;
        goto LAB_0019bbf0;
      }
    }
    uVar12 = *puVar11;
    if (uVar12 == 0) {
      fill<64U,_11U,_buffer_layout_dfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar12 = *puVar11;
      if (uVar12 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"right stream drained\n");
        sVar10 = -lVar9;
        lVar9 = -n0;
        uVar7 = *puVar1;
        goto LAB_0019bcbc;
      }
      uVar7 = *puVar1;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"L:\'");
    ppuVar8 = local_48 + (0x200 - uVar7);
    poVar5 = std::operator<<(poVar5,(char *)*ppuVar8);
    poVar5 = std::operator<<(poVar5,"\', R:\'");
    ppuVar3 = buffer + (0x97a - uVar12);
    poVar5 = std::operator<<(poVar5,(char *)*ppuVar3);
    std::operator<<(poVar5,"\'\n");
    iVar4 = cmp(*ppuVar8,*ppuVar3);
    puVar6 = puVar11;
    if (iVar4 < 1) {
      puVar6 = puVar1;
      ppuVar3 = ppuVar8;
    }
    puVar2 = *ppuVar3;
    *puVar6 = *puVar6 - 1;
    buffer[n0 + 0x4f7] = puVar2;
    check_input(local_58,n0);
    lVar9 = lVar9 + -8;
    n0 = n0 + 1;
  } while (n0 != 0x17);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"Done, buffer filled\n");
  buffer_count->_M_elems[5] = 0x17;
  goto LAB_0019be06;
LAB_0019bbf0:
  do {
    if (uVar7 == 0) {
      fill<64U,_11U,_buffer_layout_dfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar7 = *puVar11;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"both streams prematurely drained\n");
        ppuVar8 = (uchar **)((long)local_48 - sVar10);
        memmove(buffer + lVar9 + 0x50e,local_58,sVar10);
        buffer_count->_M_elems[5] = -lVar9;
        check_input(ppuVar8,-lVar9);
        goto LAB_0019be06;
      }
    }
    *(uchar **)((long)buffer + sVar10 + 0x27b8) = buffer[0x97a - uVar7];
    uVar7 = uVar7 - 1;
    *puVar11 = uVar7;
    lVar9 = lVar9 + -1;
    sVar10 = sVar10 + 8;
  } while (sVar10 != 0xb8);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"\tbuffer filled\n");
  buffer_count->_M_elems[5] = 0x17;
  check_input(local_58,0x17);
  goto LAB_0019be06;
LAB_0019bcbc:
  do {
    if (uVar7 == 0) {
      fill<64U,_10U,_buffer_layout_dfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar7 = *puVar1;
      if (uVar7 == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar5,"both streams prematurely drained\n");
        ppuVar8 = (uchar **)((long)local_48 - sVar10);
        memmove(local_48 + lVar9,local_58,sVar10);
        buffer_count->_M_elems[5] = -lVar9;
        check_input(ppuVar8,-lVar9);
        goto LAB_0019be06;
      }
    }
    *(uchar **)((long)local_48 + (sVar10 - 0xb8)) = local_48[0x200 - uVar7];
    uVar7 = uVar7 - 1;
    *puVar1 = uVar7;
    lVar9 = lVar9 + -1;
    sVar10 = sVar10 + 8;
  } while (sVar10 != 0xb8);
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar5,"buffer filled\n");
  buffer_count->_M_elems[5] = 0x17;
  check_input(local_58,0x17);
LAB_0019be06:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}